

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpainter.cpp
# Opt level: O1

void __thiscall
VPainter::drawBitmap(VPainter *this,VRect *target,VBitmap *bitmap,VRect *source,uint8_t const_alpha)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  undefined4 extraout_EAX;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  VBrush local_38;
  
  bVar9 = VBitmap::valid(bitmap);
  if (bVar9) {
    local_38.mType = NoBrush;
    local_38.field_1.mColor.a = '\0';
    local_38.field_1.mColor.r = '\0';
    local_38.field_1.mColor.g = '\0';
    local_38.field_1.mColor.b = '\0';
    VSpanData::setup(&this->mSpanData,&local_38,SrcOver,0xff);
    uVar1 = target->x2;
    uVar5 = target->y2;
    uVar2 = target->x1;
    uVar6 = target->y1;
    uVar3 = source->x2;
    uVar7 = source->y2;
    uVar4 = source->x1;
    uVar8 = source->y1;
    iVar11 = -(uint)(uVar3 - uVar4 == uVar1 - uVar2);
    iVar12 = -(uint)(uVar7 - uVar8 == uVar5 - uVar6);
    auVar10._4_4_ = iVar11;
    auVar10._0_4_ = iVar11;
    auVar10._8_4_ = iVar12;
    auVar10._12_4_ = iVar12;
    iVar11 = movmskpd(extraout_EAX,auVar10);
    if (iVar11 == 3) {
      drawBitmapUntransform(this,target,bitmap,source,const_alpha);
    }
  }
  return;
}

Assistant:

void VPainter::drawBitmap(const VRect &target, const VBitmap &bitmap,
                          const VRect &source, uint8_t const_alpha)
{
    if (!bitmap.valid()) return;

    // clear any existing brush data.
    setBrush(VBrush());

    if (target.size() == source.size()) {
        drawBitmapUntransform(target, bitmap, source, const_alpha);
    } else {
        // @TODO scaling
    }
}